

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O1

void __thiscall pbrt::CameraBase::FindMinimumDifferentials(CameraBase *this,CameraHandle *camera)

{
  undefined8 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined1 auVar4 [16];
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  int i;
  int iVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float fVar11;
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar22 [16];
  undefined1 auVar25 [56];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar31 [60];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar37;
  uint uVar38;
  Vector3f VVar39;
  optional<pbrt::CameraRayDifferential> crd;
  SampledWavelengths lambda;
  Tuple3<pbrt::Vector3,_float> local_148;
  float local_138;
  float local_134;
  float local_130;
  float local_12c;
  float local_128;
  float local_124;
  undefined1 local_120 [112];
  bool local_b0;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  Vector3f *local_88;
  Vector3f *local_80;
  Vector3f *local_78;
  Vector3f *local_70;
  CameraSample local_68;
  SampledWavelengths local_50;
  
  local_80 = &this->minDirDifferentialY;
  auVar16._8_4_ = 0x7f800000;
  auVar16._0_8_ = 0x7f8000007f800000;
  auVar16._12_4_ = 0x7f800000;
  uVar1 = vmovlps_avx(auVar16);
  (this->minDirDifferentialY).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
  (this->minDirDifferentialY).super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)uVar1 >> 0x20);
  (this->minDirDifferentialY).super_Tuple3<pbrt::Vector3,_float>.z = INFINITY;
  local_88 = &this->minDirDifferentialX;
  (this->minDirDifferentialX).super_Tuple3<pbrt::Vector3,_float>.z = INFINITY;
  uVar2 = (this->minDirDifferentialY).super_Tuple3<pbrt::Vector3,_float>.x;
  uVar3 = (this->minDirDifferentialY).super_Tuple3<pbrt::Vector3,_float>.y;
  (this->minDirDifferentialX).super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar2;
  (this->minDirDifferentialX).super_Tuple3<pbrt::Vector3,_float>.y = (float)uVar3;
  local_70 = &this->minPosDifferentialY;
  (this->minPosDifferentialY).super_Tuple3<pbrt::Vector3,_float>.z = INFINITY;
  (this->minPosDifferentialY).super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar2;
  (this->minPosDifferentialY).super_Tuple3<pbrt::Vector3,_float>.y = (float)uVar3;
  local_78 = &this->minPosDifferentialX;
  (this->minPosDifferentialX).super_Tuple3<pbrt::Vector3,_float>.z = INFINITY;
  (this->minPosDifferentialX).super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar2;
  (this->minPosDifferentialX).super_Tuple3<pbrt::Vector3,_float>.y = (float)uVar3;
  local_68.pFilm.super_Tuple2<pbrt::Point2,_float>.x = 0.0;
  local_68.pFilm.super_Tuple2<pbrt::Point2,_float>.y = 0.0;
  local_68.pLens.super_Tuple2<pbrt::Point2,_float>.x = 0.5;
  local_68.pLens.super_Tuple2<pbrt::Point2,_float>.y = 0.5;
  local_68.time = 0.5;
  local_68.weight = 1.0;
  SampledWavelengths::SampleXYZ(&local_50,0.5);
  iVar8 = 0;
  do {
    uVar1 = *(undefined8 *)
             ((this->film).super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>.bits &
             0xffffffffffff);
    local_68.pFilm.super_Tuple2<pbrt::Point2,_float>.y =
         ((float)iVar8 / 511.0) * (float)(int)((ulong)uVar1 >> 0x20);
    local_68.pFilm.super_Tuple2<pbrt::Point2,_float>.x = ((float)iVar8 / 511.0) * (float)(int)uVar1;
    CameraHandle::GenerateRayDifferential
              ((optional<pbrt::CameraRayDifferential> *)local_120,camera,&local_68,&local_50);
    uVar6 = local_120._24_4_;
    uVar5 = local_120._8_4_;
    if (local_b0 == true) {
      auVar10._8_8_ = 0;
      auVar10._0_8_ = local_120._0_8_;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = local_120._44_8_;
      auVar16 = vsubps_avx(auVar9,auVar10);
      local_148.z = (float)local_120._52_4_ - (float)local_120._8_4_;
      auVar31 = (undefined1  [60])0x0;
      local_148._0_8_ = vmovlps_avx(auVar16);
      auVar25 = (undefined1  [56])0x0;
      VVar39 = AnimatedTransform::ApplyInverse
                         ((AnimatedTransform *)this,(Vector3f *)&local_148,(Float)local_120._24_4_);
      auVar29._0_4_ = VVar39.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar29._4_60_ = auVar31;
      auVar23._0_8_ = VVar39.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar23._8_56_ = auVar25;
      auVar9 = auVar23._0_16_;
      auVar17._0_4_ =
           VVar39.super_Tuple3<pbrt::Vector3,_float>.x * VVar39.super_Tuple3<pbrt::Vector3,_float>.x
      ;
      auVar17._4_4_ =
           VVar39.super_Tuple3<pbrt::Vector3,_float>.y * VVar39.super_Tuple3<pbrt::Vector3,_float>.y
      ;
      auVar17._8_4_ = auVar25._0_4_ * auVar25._0_4_;
      auVar17._12_4_ = auVar25._4_4_ * auVar25._4_4_;
      auVar16 = vmovshdup_avx(auVar17);
      auVar16 = vfmadd231ss_fma(auVar16,auVar9,auVar9);
      auVar16 = vfmadd231ss_fma(auVar16,auVar29._0_16_,auVar29._0_16_);
      if (auVar16._0_4_ < 0.0) {
        fVar11 = sqrtf(auVar16._0_4_);
      }
      else {
        auVar16 = vsqrtss_avx(auVar16,auVar16);
        fVar11 = auVar16._0_4_;
      }
      fVar14 = (this->minPosDifferentialX).super_Tuple3<pbrt::Vector3,_float>.y;
      auVar16 = ZEXT416((uint)(this->minPosDifferentialX).super_Tuple3<pbrt::Vector3,_float>.x);
      auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar14 * fVar14)),auVar16,auVar16);
      auVar17 = ZEXT416((uint)(this->minPosDifferentialX).super_Tuple3<pbrt::Vector3,_float>.z);
      auVar16 = vfmadd213ss_fma(auVar17,auVar17,auVar16);
      if (auVar16._0_4_ < 0.0) {
        fVar14 = sqrtf(auVar16._0_4_);
      }
      else {
        auVar16 = vsqrtss_avx(auVar16,auVar16);
        fVar14 = auVar16._0_4_;
      }
      if (fVar11 < fVar14) {
        uVar1 = vmovlps_avx(auVar9);
        (this->minPosDifferentialX).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
        (this->minPosDifferentialX).super_Tuple3<pbrt::Vector3,_float>.y =
             (float)(int)((ulong)uVar1 >> 0x20);
        (this->minPosDifferentialX).super_Tuple3<pbrt::Vector3,_float>.z = auVar29._0_4_;
      }
      auVar18._8_8_ = 0;
      auVar18._0_8_ = local_120._56_8_;
      auVar16 = vsubps_avx(auVar18,auVar10);
      local_148.z = (float)local_120._64_4_ - (float)uVar5;
      auVar31 = (undefined1  [60])0x0;
      local_148._0_8_ = vmovlps_avx(auVar16);
      auVar25 = (undefined1  [56])0x0;
      VVar39 = AnimatedTransform::ApplyInverse
                         ((AnimatedTransform *)this,(Vector3f *)&local_148,(Float)uVar6);
      auVar30._0_4_ = VVar39.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar30._4_60_ = auVar31;
      auVar24._0_8_ = VVar39.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar24._8_56_ = auVar25;
      auVar9 = auVar24._0_16_;
      auVar22._0_4_ =
           VVar39.super_Tuple3<pbrt::Vector3,_float>.x * VVar39.super_Tuple3<pbrt::Vector3,_float>.x
      ;
      auVar22._4_4_ =
           VVar39.super_Tuple3<pbrt::Vector3,_float>.y * VVar39.super_Tuple3<pbrt::Vector3,_float>.y
      ;
      auVar22._8_4_ = auVar25._0_4_ * auVar25._0_4_;
      auVar22._12_4_ = auVar25._4_4_ * auVar25._4_4_;
      auVar16 = vmovshdup_avx(auVar22);
      auVar16 = vfmadd231ss_fma(auVar16,auVar9,auVar9);
      auVar16 = vfmadd231ss_fma(auVar16,auVar30._0_16_,auVar30._0_16_);
      if (auVar16._0_4_ < 0.0) {
        fVar11 = sqrtf(auVar16._0_4_);
      }
      else {
        auVar16 = vsqrtss_avx(auVar16,auVar16);
        fVar11 = auVar16._0_4_;
      }
      fVar14 = (this->minPosDifferentialY).super_Tuple3<pbrt::Vector3,_float>.y;
      auVar16 = ZEXT416((uint)(this->minPosDifferentialY).super_Tuple3<pbrt::Vector3,_float>.x);
      auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar14 * fVar14)),auVar16,auVar16);
      auVar17 = ZEXT416((uint)(this->minPosDifferentialY).super_Tuple3<pbrt::Vector3,_float>.z);
      auVar16 = vfmadd213ss_fma(auVar17,auVar17,auVar16);
      if (auVar16._0_4_ < 0.0) {
        fVar14 = sqrtf(auVar16._0_4_);
      }
      else {
        auVar16 = vsqrtss_avx(auVar16,auVar16);
        fVar14 = auVar16._0_4_;
      }
      uVar5 = local_120._20_4_;
      if (fVar11 < fVar14) {
        uVar1 = vmovlps_avx(auVar9);
        (this->minPosDifferentialY).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
        (this->minPosDifferentialY).super_Tuple3<pbrt::Vector3,_float>.y =
             (float)(int)((ulong)uVar1 >> 0x20);
        (this->minPosDifferentialY).super_Tuple3<pbrt::Vector3,_float>.z = auVar30._0_4_;
      }
      auVar33._4_4_ = local_120._16_4_;
      auVar33._0_4_ = local_120._12_4_;
      auVar33._8_8_ = 0;
      auVar19._0_4_ = (float)local_120._12_4_ * (float)local_120._12_4_;
      auVar19._4_4_ = (float)local_120._16_4_ * (float)local_120._16_4_;
      auVar19._8_8_ = 0;
      auVar16 = vmovshdup_avx(auVar19);
      auVar16 = vfmadd231ss_fma(auVar16,auVar33,auVar33);
      auVar16 = vfmadd231ss_fma(auVar16,ZEXT416((uint)local_120._20_4_),
                                ZEXT416((uint)local_120._20_4_));
      if (auVar16._0_4_ < 0.0) {
        local_120._20_4_ = sqrtf(auVar16._0_4_);
      }
      else {
        auVar16 = vsqrtss_avx(auVar16,auVar16);
        local_120._20_4_ = auVar16._0_4_;
      }
      uVar6 = local_120._76_4_;
      auVar26._4_4_ = local_120._20_4_;
      auVar26._0_4_ = local_120._20_4_;
      auVar26._8_4_ = local_120._20_4_;
      auVar26._12_4_ = local_120._20_4_;
      auVar16 = vdivps_avx(auVar33,auVar26);
      local_120._20_4_ = (float)uVar5 / (float)local_120._20_4_;
      uVar1 = vmovlps_avx(auVar16);
      local_120._12_4_ = (undefined4)uVar1;
      local_120._16_4_ = (undefined4)((ulong)uVar1 >> 0x20);
      auVar34._8_8_ = 0;
      auVar34._0_8_ = local_120._68_8_;
      auVar20._0_4_ = (float)local_120._68_8_ * (float)local_120._68_8_;
      auVar20._4_4_ = SUB84(local_120._68_8_,4) * SUB84(local_120._68_8_,4);
      auVar20._8_8_ = 0;
      auVar16 = vmovshdup_avx(auVar20);
      auVar16 = vfmadd231ss_fma(auVar16,auVar34,auVar34);
      auVar16 = vfmadd231ss_fma(auVar16,ZEXT416((uint)local_120._76_4_),
                                ZEXT416((uint)local_120._76_4_));
      if (auVar16._0_4_ < 0.0) {
        local_120._76_4_ = sqrtf(auVar16._0_4_);
      }
      else {
        auVar16 = vsqrtss_avx(auVar16,auVar16);
        local_120._76_4_ = auVar16._0_4_;
      }
      uVar5 = local_120._88_4_;
      auVar27._4_4_ = local_120._76_4_;
      auVar27._0_4_ = local_120._76_4_;
      auVar27._8_4_ = local_120._76_4_;
      auVar27._12_4_ = local_120._76_4_;
      auVar16 = vdivps_avx(auVar34,auVar27);
      local_120._76_4_ = (float)uVar6 / (float)local_120._76_4_;
      local_120._68_8_ = vmovlps_avx(auVar16);
      auVar35._8_8_ = 0;
      auVar35._0_8_ = local_120._80_8_;
      auVar21._0_4_ = (float)local_120._80_8_ * (float)local_120._80_8_;
      auVar21._4_4_ = SUB84(local_120._80_8_,4) * SUB84(local_120._80_8_,4);
      auVar21._8_8_ = 0;
      auVar16 = vmovshdup_avx(auVar21);
      auVar16 = vfmadd231ss_fma(auVar16,auVar35,auVar35);
      auVar16 = vfmadd231ss_fma(auVar16,ZEXT416((uint)local_120._88_4_),
                                ZEXT416((uint)local_120._88_4_));
      if (auVar16._0_4_ < 0.0) {
        local_120._88_4_ = sqrtf(auVar16._0_4_);
      }
      else {
        auVar16 = vsqrtss_avx(auVar16,auVar16);
        local_120._88_4_ = auVar16._0_4_;
      }
      uVar7 = local_120._20_4_;
      uVar6 = local_120._12_4_;
      auVar28._4_4_ = local_120._88_4_;
      auVar28._0_4_ = local_120._88_4_;
      auVar28._8_4_ = local_120._88_4_;
      auVar28._12_4_ = local_120._88_4_;
      auVar16 = vdivps_avx(auVar35,auVar28);
      local_120._88_4_ = (float)uVar5 / (float)local_120._88_4_;
      local_120._80_8_ = vmovlps_avx(auVar16);
      auVar32._8_4_ = 0x3f800000;
      auVar32._0_8_ = 0x3f8000003f800000;
      auVar32._12_4_ = 0x3f800000;
      auVar36._8_4_ = 0x80000000;
      auVar36._0_8_ = 0x8000000080000000;
      auVar36._12_4_ = 0x80000000;
      auVar9 = vpternlogd_avx512vl(auVar32,ZEXT416((uint)local_120._20_4_),auVar36,0xf8);
      fVar37 = auVar9._0_4_;
      fVar12 = -1.0 / (fVar37 + (float)local_120._20_4_);
      fVar11 = (float)local_120._12_4_ * (float)local_120._16_4_ * fVar12;
      auVar16 = vfmadd213ss_fma(ZEXT416((uint)((float)local_120._12_4_ *
                                              fVar37 * (float)local_120._12_4_)),
                                ZEXT416((uint)fVar12),auVar32);
      fVar14 = fVar37 * fVar11;
      fVar37 = (float)local_120._12_4_ * -fVar37;
      fVar15 = (float)local_120._16_4_ * (float)local_120._16_4_;
      local_98 = vfmadd231ss_fma(auVar9,ZEXT416((uint)fVar15),ZEXT416((uint)fVar12));
      auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar14 * (float)local_120._72_4_)),
                               ZEXT416((uint)local_120._68_4_),auVar16);
      auVar9 = vfmadd231ss_fma(auVar9,ZEXT416((uint)local_120._76_4_),ZEXT416((uint)fVar37));
      auVar17 = vfmadd231ss_fma(ZEXT416((uint)(local_98._0_4_ * (float)local_120._72_4_)),
                                ZEXT416((uint)local_120._68_4_),ZEXT416((uint)fVar11));
      local_a8 = ZEXT416((uint)local_120._16_4_);
      auVar10 = vfnmadd231ss_fma(auVar17,ZEXT416((uint)local_120._76_4_),local_a8);
      auVar17 = vfmadd231ss_fma(ZEXT416((uint)((float)local_120._16_4_ * (float)local_120._72_4_)),
                                ZEXT416((uint)local_120._12_4_),ZEXT416((uint)local_120._68_4_));
      auVar17 = vfmadd231ss_fma(auVar17,ZEXT416((uint)local_120._20_4_),
                                ZEXT416((uint)local_120._76_4_));
      local_130 = auVar10._0_4_;
      local_12c = auVar9._0_4_;
      auVar9 = vfmadd231ss_fma(ZEXT416((uint)(local_130 * local_130)),auVar9,auVar9);
      local_134 = auVar17._0_4_;
      auVar9 = vfmadd231ss_fma(auVar9,auVar17,auVar17);
      uVar38 = auVar16._0_4_;
      if (auVar9._0_4_ < 0.0) {
        fVar12 = sqrtf(auVar9._0_4_);
        auVar16 = ZEXT416(uVar38);
      }
      else {
        auVar9 = vsqrtss_avx(auVar9,auVar9);
        fVar12 = auVar9._0_4_;
      }
      auVar4._8_4_ = 0x80000000;
      auVar4._0_8_ = 0x8000000080000000;
      auVar4._12_4_ = 0x80000000;
      auVar10 = vxorps_avx512vl(local_a8,auVar4);
      auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar14 * (float)local_120._84_4_)),
                               ZEXT416((uint)local_120._80_4_),auVar16);
      auVar9 = vfmadd231ss_fma(auVar9,ZEXT416((uint)local_120._88_4_),ZEXT416((uint)fVar37));
      auVar17 = vfmadd231ss_fma(ZEXT416((uint)(local_98._0_4_ * (float)local_120._84_4_)),
                                ZEXT416((uint)local_120._80_4_),ZEXT416((uint)fVar11));
      auVar17 = vfmadd231ss_fma(auVar17,ZEXT416((uint)local_120._88_4_),auVar10);
      auVar10 = vfmadd231ss_fma(ZEXT416((uint)(local_a8._0_4_ * (float)local_120._84_4_)),
                                ZEXT416((uint)uVar6),ZEXT416((uint)local_120._80_4_));
      auVar10 = vfmadd231ss_fma(auVar10,ZEXT416((uint)uVar7),ZEXT416((uint)local_120._88_4_));
      local_124 = auVar17._0_4_;
      auVar17 = vfmadd231ss_fma(ZEXT416((uint)(local_124 * local_124)),auVar9,auVar9);
      local_128 = auVar10._0_4_;
      auVar17 = vfmadd231ss_fma(auVar17,auVar10,auVar10);
      if (auVar17._0_4_ < 0.0) {
        local_138 = fVar12;
        fVar13 = sqrtf(auVar17._0_4_);
        auVar16 = ZEXT416(uVar38);
        fVar12 = local_138;
      }
      else {
        auVar17 = vsqrtss_avx(auVar17,auVar17);
        fVar13 = auVar17._0_4_;
      }
      auVar10 = ZEXT416((uint)uVar7);
      auVar16 = vfmadd213ss_fma(auVar16,ZEXT416((uint)uVar6),
                                ZEXT416((uint)(local_a8._0_4_ * fVar14)));
      auVar16 = vfmadd213ss_fma(ZEXT416((uint)fVar37),auVar10,auVar16);
      auVar17 = vfmadd213ss_fma(ZEXT416((uint)fVar11),ZEXT416((uint)uVar6),
                                ZEXT416((uint)(local_a8._0_4_ * local_98._0_4_)));
      auVar18 = vfnmadd231ss_fma(auVar17,auVar10,local_a8);
      auVar17 = vfmadd231ss_fma(ZEXT416((uint)fVar15),ZEXT416((uint)uVar6),ZEXT416((uint)uVar6));
      auVar17 = vfmadd231ss_fma(auVar17,auVar10,auVar10);
      fVar11 = local_12c / fVar12 - auVar16._0_4_;
      fVar14 = local_130 / fVar12 - auVar18._0_4_;
      fVar37 = local_134 / fVar12 - auVar17._0_4_;
      local_98 = ZEXT416((uint)fVar14);
      auVar10 = vfmadd231ss_fma(ZEXT416((uint)(fVar14 * fVar14)),ZEXT416((uint)fVar11),
                                ZEXT416((uint)fVar11));
      auVar10 = vfmadd231ss_fma(auVar10,ZEXT416((uint)fVar37),ZEXT416((uint)fVar37));
      if (auVar10._0_4_ < 0.0) {
        fVar14 = sqrtf(auVar10._0_4_);
      }
      else {
        auVar10 = vsqrtss_avx(auVar10,auVar10);
        fVar14 = auVar10._0_4_;
      }
      fVar15 = (this->minDirDifferentialX).super_Tuple3<pbrt::Vector3,_float>.y;
      auVar10 = ZEXT416((uint)(this->minDirDifferentialX).super_Tuple3<pbrt::Vector3,_float>.x);
      auVar10 = vfmadd231ss_fma(ZEXT416((uint)(fVar15 * fVar15)),auVar10,auVar10);
      auVar22 = ZEXT416((uint)(this->minDirDifferentialX).super_Tuple3<pbrt::Vector3,_float>.z);
      auVar10 = vfmadd213ss_fma(auVar22,auVar22,auVar10);
      if (auVar10._0_4_ < 0.0) {
        local_a8._0_4_ = fVar14;
        fVar15 = sqrtf(auVar10._0_4_);
        fVar14 = (float)local_a8._0_4_;
      }
      else {
        auVar10 = vsqrtss_avx(auVar10,auVar10);
        fVar15 = auVar10._0_4_;
      }
      if (fVar14 < fVar15) {
        auVar10 = vinsertps_avx(ZEXT416((uint)fVar11),ZEXT416((uint)local_98._0_4_),0x10);
        uVar1 = vmovlps_avx(auVar10);
        (this->minDirDifferentialX).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
        (this->minDirDifferentialX).super_Tuple3<pbrt::Vector3,_float>.y =
             (float)(int)((ulong)uVar1 >> 0x20);
        (this->minDirDifferentialX).super_Tuple3<pbrt::Vector3,_float>.z = fVar37;
      }
      fVar11 = auVar9._0_4_ / fVar13 - auVar16._0_4_;
      fVar14 = local_124 / fVar13 - auVar18._0_4_;
      fVar37 = local_128 / fVar13 - auVar17._0_4_;
      auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar14 * fVar14)),ZEXT416((uint)fVar11),
                                ZEXT416((uint)fVar11));
      auVar16 = vfmadd231ss_fma(auVar16,ZEXT416((uint)fVar37),ZEXT416((uint)fVar37));
      if (auVar16._0_4_ < 0.0) {
        fVar15 = sqrtf(auVar16._0_4_);
      }
      else {
        auVar16 = vsqrtss_avx(auVar16,auVar16);
        fVar15 = auVar16._0_4_;
      }
      fVar12 = (this->minDirDifferentialY).super_Tuple3<pbrt::Vector3,_float>.y;
      auVar16 = ZEXT416((uint)(this->minDirDifferentialY).super_Tuple3<pbrt::Vector3,_float>.x);
      auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar12 * fVar12)),auVar16,auVar16);
      auVar9 = ZEXT416((uint)(this->minDirDifferentialY).super_Tuple3<pbrt::Vector3,_float>.z);
      auVar16 = vfmadd213ss_fma(auVar9,auVar9,auVar16);
      if (auVar16._0_4_ < 0.0) {
        fVar12 = sqrtf(auVar16._0_4_);
      }
      else {
        auVar16 = vsqrtss_avx(auVar16,auVar16);
        fVar12 = auVar16._0_4_;
      }
      if (fVar15 < fVar12) {
        auVar16 = vinsertps_avx(ZEXT416((uint)fVar11),ZEXT416((uint)fVar14),0x10);
        uVar1 = vmovlps_avx(auVar16);
        (this->minDirDifferentialY).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
        (this->minDirDifferentialY).super_Tuple3<pbrt::Vector3,_float>.y =
             (float)(int)((ulong)uVar1 >> 0x20);
        (this->minDirDifferentialY).super_Tuple3<pbrt::Vector3,_float>.z = fVar37;
      }
      local_b0 = false;
    }
    iVar8 = iVar8 + 1;
  } while (iVar8 != 0x200);
  if (LOGGING_LogLevel < 1) {
    local_120._8_4_ = 0;
    local_120._12_4_ = 0;
    local_120._16_4_ = local_120._16_4_ & 0xffffff00;
    local_120._0_8_ = (long)local_120 + 0x10;
    detail::stringPrintfRecursive<pbrt::Vector3<float>&,pbrt::Vector3<float>&>
              ((string *)local_120,"Camera min pos differentials: %s, %s",local_78,local_70);
    Log(Verbose,
        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cameras.cpp"
        ,0xde,(char *)local_120._0_8_);
    if (local_120._0_8_ != (long)local_120 + 0x10) {
      operator_delete((void *)local_120._0_8_,CONCAT44(local_120._20_4_,local_120._16_4_) + 1);
    }
  }
  if (LOGGING_LogLevel < 1) {
    local_120._8_4_ = 0;
    local_120._12_4_ = 0;
    local_120._16_4_ = local_120._16_4_ & 0xffffff00;
    local_120._0_8_ = (long)local_120 + 0x10;
    detail::stringPrintfRecursive<pbrt::Vector3<float>&,pbrt::Vector3<float>&>
              ((string *)local_120,"Camera min dir differentials: %s, %s",local_88,local_80);
    Log(Verbose,
        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cameras.cpp"
        ,0xe0,(char *)local_120._0_8_);
    if (local_120._0_8_ != (long)local_120 + 0x10) {
      operator_delete((void *)local_120._0_8_,CONCAT44(local_120._20_4_,local_120._16_4_) + 1);
    }
  }
  return;
}

Assistant:

void CameraBase::FindMinimumDifferentials(CameraHandle camera) {
    minPosDifferentialX = minPosDifferentialY = minDirDifferentialX =
        minDirDifferentialY = Vector3f(Infinity, Infinity, Infinity);

    CameraSample sample;
    sample.pLens = Point2f(0.5, 0.5);
    sample.time = 0.5;
    SampledWavelengths lambda = SampledWavelengths::SampleXYZ(0.5);

    int n = 512;
    for (int i = 0; i < n; ++i) {
        sample.pFilm.x = Float(i) / (n - 1) * film.FullResolution().x;
        sample.pFilm.y = Float(i) / (n - 1) * film.FullResolution().y;

        pstd::optional<CameraRayDifferential> crd =
            camera.GenerateRayDifferential(sample, lambda);
        if (!crd)
            continue;

        RayDifferential &ray = crd->ray;
        Vector3f dox = CameraFromRender(ray.rxOrigin - ray.o, ray.time);
        if (Length(dox) < Length(minPosDifferentialX))
            minPosDifferentialX = dox;
        Vector3f doy = CameraFromRender(ray.ryOrigin - ray.o, ray.time);
        if (Length(doy) < Length(minPosDifferentialY))
            minPosDifferentialY = doy;

        ray.d = Normalize(ray.d);
        ray.rxDirection = Normalize(ray.rxDirection);
        ray.ryDirection = Normalize(ray.ryDirection);

        Frame f = Frame::FromZ(ray.d);
        Vector3f df = f.ToLocal(ray.d);  // should be (0, 0, 1);
        Vector3f dxf = Normalize(f.ToLocal(ray.rxDirection));
        Vector3f dyf = Normalize(f.ToLocal(ray.ryDirection));

        if (Length(dxf - df) < Length(minDirDifferentialX))
            minDirDifferentialX = dxf - df;
        if (Length(dyf - df) < Length(minDirDifferentialY))
            minDirDifferentialY = dyf - df;
    }

    LOG_VERBOSE("Camera min pos differentials: %s, %s", minPosDifferentialX,
                minPosDifferentialY);
    LOG_VERBOSE("Camera min dir differentials: %s, %s", minDirDifferentialX,
                minDirDifferentialY);
}